

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool Fossilize::Hashing::compute_hash_render_pass
               (VkRenderPassCreateInfo *create_info,Hash *out_hash)

{
  VkSubpassDescription *pVVar1;
  VkAttachmentDescription *pVVar2;
  VkSubpassDependency *pVVar3;
  VkAttachmentReference *pVVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint32_t i;
  ulong uVar12;
  ulong uVar13;
  Hasher local_38;
  
  local_38.h = 0xcbf29ce484222325;
  if ((ulong)create_info->flags != 0) {
    local_38.h = (ulong)create_info->flags ^ 0xaf63bd4c8601b7df;
  }
  uVar6 = (ulong)create_info->attachmentCount;
  uVar8 = (ulong)create_info->dependencyCount;
  uVar7 = (ulong)create_info->subpassCount;
  local_38.h = ((local_38.h * 0x100000001b3 ^ uVar6) * 0x100000001b3 ^ uVar8) * 0x100000001b3 ^
               uVar7;
  if (uVar6 != 0) {
    pVVar2 = create_info->pAttachments;
    lVar9 = 0;
    do {
      local_38.h = ((((((((local_38.h * 0x100000001b3 ^
                          (ulong)*(uint *)((long)&pVVar2->flags + lVar9)) * 0x100000001b3 ^
                         (ulong)*(uint *)((long)&pVVar2->initialLayout + lVar9)) * 0x100000001b3 ^
                        (ulong)*(uint *)((long)&pVVar2->finalLayout + lVar9)) * 0x100000001b3 ^
                       (ulong)*(uint *)((long)&pVVar2->format + lVar9)) * 0x100000001b3 ^
                      (ulong)*(uint *)((long)&pVVar2->loadOp + lVar9)) * 0x100000001b3 ^
                     (ulong)*(uint *)((long)&pVVar2->storeOp + lVar9)) * 0x100000001b3 ^
                    (ulong)*(uint *)((long)&pVVar2->stencilLoadOp + lVar9)) * 0x100000001b3 ^
                   (ulong)*(uint *)((long)&pVVar2->stencilStoreOp + lVar9)) * 0x100000001b3 ^
                   (ulong)*(uint *)((long)&pVVar2->samples + lVar9);
      lVar9 = lVar9 + 0x24;
    } while (uVar6 * 0x24 != lVar9);
  }
  if (uVar8 != 0) {
    pVVar3 = create_info->pDependencies;
    lVar9 = 0;
    do {
      local_38.h = ((((((local_38.h * 0x100000001b3 ^
                        (ulong)*(uint *)((long)&pVVar3->dependencyFlags + lVar9)) * 0x100000001b3 ^
                       (ulong)*(uint *)((long)&pVVar3->dstAccessMask + lVar9)) * 0x100000001b3 ^
                      (ulong)*(uint *)((long)&pVVar3->srcAccessMask + lVar9)) * 0x100000001b3 ^
                     (ulong)*(uint *)((long)&pVVar3->srcSubpass + lVar9)) * 0x100000001b3 ^
                    (ulong)*(uint *)((long)&pVVar3->dstSubpass + lVar9)) * 0x100000001b3 ^
                   (ulong)*(uint *)((long)&pVVar3->srcStageMask + lVar9)) * 0x100000001b3 ^
                   (ulong)*(uint *)((long)&pVVar3->dstStageMask + lVar9);
      lVar9 = lVar9 + 0x1c;
    } while (uVar8 * 0x1c != lVar9);
  }
  if (uVar7 != 0) {
    uVar8 = 0;
    do {
      pVVar1 = create_info->pSubpasses + uVar8;
      uVar10 = (ulong)pVVar1->colorAttachmentCount;
      uVar12 = (ulong)pVVar1->inputAttachmentCount;
      uVar13 = (ulong)pVVar1->preserveAttachmentCount;
      uVar6 = ((((local_38.h * 0x100000001b3 ^ (ulong)pVVar1->flags) * 0x100000001b3 ^ uVar10) *
                0x100000001b3 ^ uVar12) * 0x100000001b3 ^ uVar13) * 0x100000001b3 ^
              (ulong)pVVar1->pipelineBindPoint;
      if (uVar13 != 0) {
        uVar11 = 0;
        do {
          uVar6 = uVar6 * 0x100000001b3 ^ (ulong)pVVar1->pPreserveAttachments[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar13 != uVar11);
      }
      if (uVar10 != 0) {
        uVar13 = 0;
        do {
          uVar6 = (uVar6 * 0x100000001b3 ^ (ulong)pVVar1->pColorAttachments[uVar13].attachment) *
                  0x100000001b3 ^ (ulong)pVVar1->pColorAttachments[uVar13].layout;
          uVar13 = uVar13 + 1;
        } while (uVar10 != uVar13);
      }
      if (uVar12 != 0) {
        uVar13 = 0;
        do {
          uVar6 = (uVar6 * 0x100000001b3 ^ (ulong)pVVar1->pInputAttachments[uVar13].attachment) *
                  0x100000001b3 ^ (ulong)pVVar1->pInputAttachments[uVar13].layout;
          uVar13 = uVar13 + 1;
        } while (uVar12 != uVar13);
      }
      pVVar4 = pVVar1->pResolveAttachments;
      if (pVVar1->colorAttachmentCount != 0 && pVVar4 != (VkAttachmentReference *)0x0) {
        uVar12 = 0;
        do {
          uVar6 = (uVar6 * 0x100000001b3 ^ (ulong)pVVar4[uVar12].attachment) * 0x100000001b3 ^
                  (ulong)pVVar4[uVar12].layout;
          uVar12 = uVar12 + 1;
        } while (uVar10 != uVar12);
      }
      pVVar4 = pVVar1->pDepthStencilAttachment;
      if (pVVar4 == (VkAttachmentReference *)0x0) {
        local_38.h = uVar6 * 0x100000001b3;
      }
      else {
        local_38.h = (uVar6 * 0x100000001b3 ^ (ulong)pVVar4->attachment) * 0x100000001b3 ^
                     (ulong)pVVar4->layout;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar7);
  }
  bVar5 = hash_pnext_chain((StateRecorder *)0x0,&local_38,create_info->pNext,(DynamicStateInfo *)0x0
                           ,0);
  if (bVar5) {
    *out_hash = local_38.h;
  }
  return bVar5;
}

Assistant:

bool compute_hash_render_pass(const VkRenderPassCreateInfo &create_info, Hash *out_hash)
{
	Hasher h;

	// Conditionally branch to remain hash compatible.
	if (create_info.flags != 0)
		h.u32(create_info.flags);

	h.u32(create_info.attachmentCount);
	h.u32(create_info.dependencyCount);
	h.u32(create_info.subpassCount);

	for (uint32_t i = 0; i < create_info.attachmentCount; i++)
	{
		auto &att = create_info.pAttachments[i];
		hash_attachment(h, att);
	}

	for (uint32_t i = 0; i < create_info.dependencyCount; i++)
	{
		auto &dep = create_info.pDependencies[i];
		hash_dependency(h, dep);
	}

	for (uint32_t i = 0; i < create_info.subpassCount; i++)
	{
		auto &subpass = create_info.pSubpasses[i];
		hash_subpass(h, subpass);
	}

	if (!hash_pnext_chain(nullptr, h, create_info.pNext, nullptr, 0))
		return false;

	*out_hash = h.get();
	return true;
}